

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

ssize_t __thiscall
anon_unknown.dwarf_3027f24::Pipe::read(Pipe *this,int __fd,void *__buf,size_t __nbytes)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  byte bVar3;
  undefined4 in_register_00000034;
  void *pvVar4;
  void *pvVar5;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  pvVar4 = (void *)0x0;
  do {
    bVar3 = this->closed;
    if ((bool)bVar3 == false) {
      do {
        ppuVar1 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        if ((this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_start._M_last +
            (long)((this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur +
                  (((((ulong)((long)ppuVar1 -
                             (long)(this->data).
                                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(this->data).
                        super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first)) !=
            (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur) break;
        std::condition_variable::wait((unique_lock *)&this->cv);
        bVar3 = this->closed;
      } while ((bool)bVar3 != true);
    }
    pvVar5 = pvVar4;
    if ((bVar3 & 1) != 0) break;
    pvVar5 = __buf;
    if (pvVar4 < __buf) {
      while (ppuVar1 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node,
            puVar2 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_cur,
            (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_start._M_last +
            (long)((this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur +
                  (((((ulong)((long)ppuVar1 -
                             (long)(this->data).
                                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(this->data).
                        super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first)) != puVar2) {
        *(uchar *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar4) = *puVar2;
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->data);
        pvVar4 = (void *)((long)pvVar4 + 1);
        if (__buf == pvVar4) goto LAB_007f589b;
      }
    }
  } while (pvVar4 != __buf);
LAB_007f589b:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return (ssize_t)pvVar5;
}

Assistant:

size_t read(void* buffer, size_t bytes) override {
    std::unique_lock<std::mutex> lock(mutex);
    auto out = reinterpret_cast<uint8_t*>(buffer);
    size_t n = 0;
    while (true) {
      cv.wait(lock, [&] { return closed || data.size() > 0; });
      if (closed) {
        return n;
      }
      for (; n < bytes && data.size() > 0; n++) {
        out[n] = data.front();
        data.pop_front();
      }
      if (n == bytes) {
        return n;
      }
    }
  }